

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

cio_error cio_socket_connect(cio_socket *socket,cio_socket_address *endpoint,
                            cio_connect_handler_t handler,void *handler_context)

{
  int iVar1;
  cio_error cVar2;
  int *piVar3;
  
  cVar2 = CIO_INVALID_ARGUMENT;
  if ((endpoint != (cio_socket_address *)0x0 && socket != (cio_socket *)0x0) &&
     ((endpoint->impl).sa.socket_address.addr.sa_family != 0)) {
    iVar1 = connect((socket->impl).ev.fd,(sockaddr *)&(endpoint->impl).sa.socket_address,
                    (endpoint->impl).len);
    if (iVar1 == 0) {
      cVar2 = CIO_SUCCESS;
      (*handler)(socket,handler_context,CIO_SUCCESS);
    }
    else {
      piVar3 = __errno_location();
      if (*piVar3 == 0x73) {
        socket->handler = handler;
        socket->handler_context = handler_context;
        (socket->impl).ev.context = socket;
        (socket->impl).ev.write_callback = connect_callback;
        cVar2 = cio_linux_eventloop_register_write((socket->impl).loop,&(socket->impl).ev);
        return cVar2;
      }
      cVar2 = -*piVar3;
    }
  }
  return cVar2;
}

Assistant:

enum cio_error cio_socket_connect(struct cio_socket *socket, const struct cio_socket_address *endpoint, cio_connect_handler_t handler, void *handler_context)
{
	if (cio_unlikely(socket == NULL) || (endpoint == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	if (cio_unlikely((enum cio_address_family)endpoint->impl.sa.socket_address.addr.sa_family == CIO_ADDRESS_FAMILY_UNSPEC)) {
		return CIO_INVALID_ARGUMENT;
	}

	int ret = connect(socket->impl.ev.fd, &endpoint->impl.sa.socket_address.addr, endpoint->impl.len);
	if (ret == 0) {
		handler(socket, handler_context, CIO_SUCCESS);
	} else {
		if (cio_likely(errno == EINPROGRESS)) {
			socket->handler = handler;
			socket->handler_context = handler_context;
			socket->impl.ev.context = socket;
			socket->impl.ev.write_callback = connect_callback;
			return cio_linux_eventloop_register_write(socket->impl.loop, &socket->impl.ev);
		}

		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}